

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O2

quint64 __thiscall AudioStream::estimateMIDITimestamp(AudioStream *this,MasterClockNanos midiNanos)

{
  uint uVar1;
  uint uVar2;
  QDebug *pQVar3;
  quint64 qVar4;
  quint64 t;
  long t_00;
  QDebug local_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  char *local_30;
  
  do {
    uVar1 = (this->timeInfoChangeCount).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i;
    uVar2 = uVar1 & 1;
  } while (uVar1 != (this->timeInfoChangeCount).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i);
  do {
    uVar1 = (this->renderedFramesChangeCount).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i;
    qVar4 = this->renderedFramesCounts[uVar1 & 1];
  } while (uVar1 != (this->renderedFramesChangeCount).super_QAtomicInteger<int>.
                    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i);
  t = this->timeInfos[uVar2].lastPlayedFramesCount + (ulong)this->midiLatencyFrames +
      (long)((this->timeInfos[uVar2].actualSampleRate *
             (double)(midiNanos - this->timeInfos[uVar2].lastPlayedNanos)) / 1000000000.0);
  t_00 = t - qVar4;
  if (t_00 < 0) {
    if (this->settings->midiLatency == 0) {
      this->midiLatencyFrames = this->midiLatencyFrames - (int)t_00;
    }
    local_48 = 2;
    local_34 = 0;
    local_44 = 0;
    uStack_3c = 0;
    local_30 = "default";
    QMessageLogger::debug();
    pQVar3 = QDebug::operator<<(&local_50,"L");
    pQVar3 = QDebug::operator<<(pQVar3,qVar4);
    pQVar3 = QDebug::operator<<(pQVar3,t);
    pQVar3 = QDebug::operator<<(pQVar3,t_00);
    QDebug::operator<<(pQVar3,this->midiLatencyFrames);
    QDebug::~QDebug(&local_50);
  }
  qVar4 = 0;
  if (0 < (long)t) {
    qVar4 = t;
  }
  return qVar4;
}

Assistant:

quint64 AudioStream::estimateMIDITimestamp(const MasterClockNanos midiNanos) {
	TimeInfo timeInfo;
	takeSnapshot(timeInfo, timeInfos, timeInfoChangeCount);
	quint64 renderedFramesCount;
	takeSnapshot(renderedFramesCount, renderedFramesCounts, renderedFramesChangeCount);

	qint64 refFrameOffset = qint64(((midiNanos - timeInfo.lastPlayedNanos) * timeInfo.actualSampleRate) / MasterClock::NANOS_PER_SECOND);
	qint64 timestamp = qint64(timeInfo.lastPlayedFramesCount) + refFrameOffset + qint64(midiLatencyFrames);
	qint64 delay = timestamp - qint64(renderedFramesCount);
	if (delay < 0) {
		// Negative delay means our timing is broken. We want to absorb all the jitter while keeping the latency at the minimum.
		if (isAutoLatencyMode()) {
			midiLatencyFrames -= delay;
		}
		qDebug() << "L" << renderedFramesCount << timestamp << delay << midiLatencyFrames;
	}
	return timestamp < 0 ? 0 : quint64(timestamp);
}